

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

char * iniparser_getsecname(dictionary *d,int n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar4 = (char *)0x0;
  if (-1 < n && d != (dictionary *)0x0) {
    pcVar5 = (char *)d->size;
    if ((long)d->size < 1) {
      pcVar5 = pcVar4;
    }
    pcVar6 = (char *)0x0;
    while ((uVar3 = (uint)pcVar4, pcVar4 = pcVar5, uVar2 = uVar3, pcVar5 != pcVar6 &&
           (((d->key[(long)pcVar6] == (char *)0x0 ||
             (pcVar4 = strchr(d->key[(long)pcVar6],0x3a), pcVar4 != (char *)0x0)) ||
            (uVar2 = uVar3 + 1, bVar1 = (int)uVar3 < n, pcVar4 = pcVar6, uVar3 = uVar2, bVar1))))) {
      pcVar6 = pcVar6 + 1;
      pcVar4 = (char *)(ulong)uVar3;
    }
    if (n < (int)uVar2) {
      pcVar4 = d->key[(long)pcVar4];
    }
    else {
      pcVar4 = (char *)0x0;
    }
  }
  return pcVar4;
}

Assistant:

const char * iniparser_getsecname(const dictionary * d, int n)
{
    int i ;
    int foundsec ;

    if (d == NULL || n < 0) return NULL ;
    foundsec = 0 ;
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        if (strchr(d->key[i], ':') == NULL) {
            foundsec++ ;
            if (foundsec > n)
                break ;
        }
    }
    if (foundsec <= n) {
        return NULL ;
    }
    return d->key[i] ;
}